

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O0

void __thiscall
cornerstone::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> p_00;
  element_type *peVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  size_type sVar8;
  undefined4 extraout_var_00;
  element_type *peVar9;
  ulong uVar10;
  ulong uVar11;
  resp_msg *in_RSI;
  raft_server *in_RDI;
  lock_guard<std::mutex> guard_1;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  lock_guard<std::mutex> guard;
  ptr<peer> p;
  bool need_to_catchup;
  peer_itor it;
  shared_lock<std::shared_timed_mutex> rlock;
  unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
  *in_stack_fffffffffffffd98;
  element_type *in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  raft_server *in_stack_fffffffffffffde0;
  bool local_202;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_140;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_138;
  __node_type *local_130;
  int local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_120 [2];
  bool local_e9;
  undefined4 local_e8;
  allocator<char> local_e1;
  strfmt<100> local_e0;
  string local_70 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_50 [3]
  ;
  int32 local_34;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_28 [3]
  ;
  resp_msg *local_10;
  
  local_10 = in_RSI;
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffda0,
             (mutex_type *)in_stack_fffffffffffffd98);
  local_34 = msg_base::get_src(&local_10->super_msg_base);
  p_00._M_cur = (__node_type *)
                std::
                unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                ::find(in_stack_fffffffffffffd98,(key_type *)0x1ded78);
  local_30._M_cur = p_00._M_cur;
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
              *)in_stack_fffffffffffffda0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
              *)in_stack_fffffffffffffd98);
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
       ::end(in_stack_fffffffffffffd98);
  bVar1 = std::__detail::operator==(local_28,local_50);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1dedf5);
    iVar2 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    strfmt<100>::strfmt(&local_e0,"the response is from an unkonw peer %d");
    msg_base::get_src(&local_10->super_msg_base);
    strfmt<100>::fmt<int>((strfmt<100> *)in_stack_fffffffffffffda0,iVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    (*peVar3->_vptr_logger[3])(peVar3,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_e1);
    local_e8 = 1;
    goto LAB_001df53f;
  }
  local_e9 = true;
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>::
  operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
              *)0x1def37);
  std::shared_ptr<cornerstone::peer>::shared_ptr
            ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffffda0,
             (shared_ptr<cornerstone::peer> *)in_stack_fffffffffffffd98);
  bVar1 = resp_msg::get_accepted(local_10);
  if (bVar1) {
    peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1def7e);
    peer::get_lock(peVar9);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffda0,
               (mutex_type *)in_stack_fffffffffffffd98);
    peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1defb4);
    uVar10 = resp_msg::get_next_idx(local_10);
    peer::set_next_log_idx(peVar9,uVar10);
    peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1deff7);
    uVar10 = resp_msg::get_next_idx(local_10);
    peer::set_matched_idx(peVar9,uVar10 - 1);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1df03d);
    std::
    unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
    ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
            *)0x1df04e);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1df06e);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1df09a);
    peVar4 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1df0ae);
    iVar2 = (*peVar4->_vptr_log_store[2])();
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_120,0);
    *pvVar5 = CONCAT44(extraout_var,iVar2) - 1;
    local_128 = 1;
    local_138._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
         ::begin(in_stack_fffffffffffffd98);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                *)in_stack_fffffffffffffda0,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                *)in_stack_fffffffffffffd98);
    local_28[0]._M_cur = local_130;
    while( true ) {
      local_140._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
           ::end(in_stack_fffffffffffffd98);
      bVar1 = std::__detail::operator!=(local_28,&local_140);
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
      ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                    *)0x1df181);
      peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df18d);
      uVar10 = peer::get_matched_idx(peVar9);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_120,(long)local_128);
      *pvVar5 = uVar10;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
      ::operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                    *)in_stack_fffffffffffffda0);
      local_128 = local_128 + 1;
    }
    iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffd98);
    iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffd98);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::greater<unsigned_long>>
              (iVar6._M_current,iVar7._M_current);
    sVar8 = std::
            unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
            ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                    *)0x1df2bb);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_120,sVar8 + 1 >> 1)
    ;
    commit(in_stack_fffffffffffffde0,(ulong)in_stack_fffffffffffffdd8);
    std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1df2f0);
    bVar1 = peer::clear_pending_commit(in_stack_fffffffffffffda0);
    local_202 = true;
    if (!bVar1) {
      uVar10 = resp_msg::get_next_idx(local_10);
      peVar4 = std::
               __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df337);
      iVar2 = (*peVar4->_vptr_log_store[2])();
      local_202 = uVar10 < CONCAT44(extraout_var_00,iVar2);
    }
    local_e9 = local_202;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0);
  }
  else {
    peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1df38a);
    peer::get_lock(peVar9);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffda0,
               (mutex_type *)in_stack_fffffffffffffd98);
    uVar10 = resp_msg::get_next_idx(local_10);
    if (uVar10 == 0) {
LAB_001df471:
      peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df47e);
      uVar10 = peer::get_next_log_idx(peVar9);
      if (uVar10 != 0) {
        in_stack_fffffffffffffda0 =
             std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1df4a9);
        peVar9 = std::
                 __shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df4b7);
        uVar10 = peer::get_next_log_idx(peVar9);
        peer::set_next_log_idx(in_stack_fffffffffffffda0,uVar10 - 1);
      }
    }
    else {
      peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df3dd);
      uVar10 = peer::get_next_log_idx(peVar9);
      uVar11 = resp_msg::get_next_idx(local_10);
      if (uVar10 <= uVar11) goto LAB_001df471;
      peVar9 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df41c);
      uVar10 = resp_msg::get_next_idx(local_10);
      peer::set_next_log_idx(peVar9,uVar10);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1df4eb);
  }
  if ((in_RDI->role_ == leader) && ((local_e9 & 1U) != 0)) {
    std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffda0);
    request_append_entries(in_RDI,(peer *)p_00._M_cur);
  }
  std::shared_ptr<cornerstone::peer>::~shared_ptr((shared_ptr<cornerstone::peer> *)0x1df534);
  local_e8 = 0;
LAB_001df53f:
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffda0);
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        {
            auto_lock(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            p->set_matched_idx(resp.get_next_idx() - 1);
        }

        // try to commit with this response
        std::vector<ulong> matched_indexes(peers_.size() + 1);
        matched_indexes[0] = log_store_->next_slot() - 1;
        int i = 1;
        for (it = peers_.begin(); it != peers_.end(); ++it, i++)
        {
            matched_indexes[i] = it->second->get_matched_idx();
        }

        std::sort(matched_indexes.begin(), matched_indexes.end(), std::greater<ulong>());
        commit(matched_indexes[(peers_.size() + 1) / 2]);
        need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
    }
    else
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        if (resp.get_next_idx() > 0 && p->get_next_log_idx() > resp.get_next_idx())
        {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        }
        else if (p->get_next_log_idx() > 0)
        {
            p->set_next_log_idx(p->get_next_log_idx() - 1);
        }
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}